

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O0

void __thiscall BmsNoteManager::FixIncorrectLongNote(BmsNoteManager *this)

{
  barindex bar_00;
  bool bVar1;
  reference piVar2;
  _Self *__x;
  _Self local_b0;
  _Rb_tree_const_iterator<int> local_a8;
  iterator nextit;
  BmsNote _tmp;
  int c;
  barindex bar;
  _Self local_70;
  iterator it;
  undefined1 local_58 [8];
  set<int,_std::less<int>,_std::allocator<int>_> notemap;
  bool isln [20];
  BmsNoteManager *this_local;
  
  notemap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
  GetNoteExistBar(this,(set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
  local_70._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
  while( true ) {
    _c = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
    bVar1 = std::operator!=(&local_70,(_Self *)&c);
    if (!bVar1) break;
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&local_70);
    bar_00 = *piVar2;
    for (_tmp.status = 0; _tmp.status < 0x14; _tmp.status = _tmp.status + 1) {
      BmsNoteLane::Get((BmsNote *)&nextit,this->lanes_ + _tmp.status,bar_00);
      if ((int)nextit._M_node == 2) {
        if ((isln[(long)_tmp.status + -8] & 1U) == 1) {
          BmsNoteLane::Delete(this->lanes_ + _tmp.status,bar_00);
        }
        isln[(long)_tmp.status + -8] = true;
      }
      else if ((int)nextit._M_node == 3) {
        if ((isln[(long)_tmp.status + -8] & 1U) == 0) {
          local_a8._M_node = local_70._M_node;
          __x = std::_Rb_tree_const_iterator<int>::operator++(&local_a8);
          local_b0._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::end
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
          bVar1 = std::operator==(__x,&local_b0);
          if (bVar1) {
            nextit._M_node._0_4_ = 1;
          }
          else {
            nextit._M_node._0_4_ = 2;
          }
          BmsNoteLane::Set(this->lanes_ + _tmp.status,bar_00,(BmsNote *)&nextit);
        }
        isln[(long)_tmp.status + -8] = false;
      }
      BmsNote::~BmsNote((BmsNote *)&nextit);
    }
    std::_Rb_tree_const_iterator<int>::operator++(&local_70);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
  return;
}

Assistant:

void BmsNoteManager::FixIncorrectLongNote() {
	// there's may be 2 cases -
	// - LN_START after LN_START / LN_END after LN_END
	// - NORMAL_NOTE during LN
	// first case must be fixed.
	// second case well.. removing note isn't solution because keysound will be deleted.
	// (you'll get miss if you don't hit not during LN... or act like HELLCHARGE note.)
	bool isln[20] = { false, };
	std::set<barindex> notemap;
	GetNoteExistBar(notemap);
	for (auto it = notemap.begin(); it != notemap.end(); ++it) {
		barindex bar = *it;
		for (int c = 0; c < 20; c++) {
			BmsNote _tmp = lanes_[c].Get(bar);
			/*
			 * case: LNSTART reached, but currently considered as longnote status
			 * solution: ignore current note
			 */
			if (_tmp.type == BmsNote::NOTE_LNSTART) {
				if (isln[c] == true) {
					lanes_[c].Delete(bar);
				}
				isln[c] = true;
			}
			/*
			 * case: LNEND reached, but current note wasn't longnote.
			 * solution: set NORMAL
			 */
			else if (_tmp.type == BmsNote::NOTE_LNEND) {
				if (isln[c] == false) {
					auto nextit = it;
					if (++nextit == notemap.end())
						_tmp.type = BmsNote::NOTE_NORMAL;
					else
						_tmp.type = BmsNote::NOTE_LNSTART;
					lanes_[c].Set(bar, _tmp);
				}
				isln[c] = false;
			}
		}
	}
}